

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O3

void __thiscall Control::Control(Control *this,int type_,string *name_)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (name_->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name_->_M_string_length);
  Element::Element(&this->super_Element,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__Control_00156b70;
  *(int *)&(this->super_Element).field_0x2c = type_;
  this->link = (Link *)0x0;
  this->status = 2;
  this->setting = 0.0;
  this->node = (Node *)0x0;
  this->head = 0.0;
  this->volume = 0.0;
  this->levelType = NO_LEVEL;
  this->time = 0;
  return;
}

Assistant:

Control::Control(int type_, string name_) :
    Element(name_),
    type(type_),
    link(nullptr),
    status(NO_STATUS),
    setting(0.0),
    node(nullptr),
    head(0.0),
    volume(0.0),
    levelType(NO_LEVEL),
    time(0)
{
}